

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O2

double aom_normalized_cross_correlation(double *a,double *b,int n)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)n;
  if (n < 1) {
    uVar4 = uVar3;
  }
  dVar5 = 0.0;
  dVar6 = 0.0;
  dVar7 = 0.0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dVar1 = b[uVar3];
    dVar7 = dVar7 + dVar1 * dVar1;
    dVar2 = a[uVar3];
    dVar5 = dVar5 + dVar2 * dVar1;
    dVar6 = dVar6 + dVar2 * dVar2;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  return dVar5 / (dVar6 * dVar7);
}

Assistant:

double aom_normalized_cross_correlation(const double *a, const double *b,
                                        int n) {
  double c = 0;
  double a_len = 0;
  double b_len = 0;
  for (int i = 0; i < n; ++i) {
    a_len += a[i] * a[i];
    b_len += b[i] * b[i];
    c += a[i] * b[i];
  }
  return c / (sqrt(a_len) * sqrt(b_len));
}